

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectShadow.cpp
# Opt level: O0

void __thiscall
Rml::FontEffectShadowInstancer::FontEffectShadowInstancer(FontEffectShadowInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_299;
  String local_298;
  allocator<char> local_271;
  String local_270;
  allocator<char> local_249;
  String local_248;
  allocator<char> local_221;
  String local_220;
  allocator<char> local_1f9;
  String local_1f8;
  allocator<char> local_1d1;
  String local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  FontEffectShadowInstancer *local_10;
  FontEffectShadowInstancer *this_local;
  
  local_10 = this;
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectShadowInstancer_00817c98;
  this->id_offset_x = Invalid;
  this->id_offset_y = Invalid;
  this->id_color = Invalid;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"offset-x",&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"0px",&local_69);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_30,&local_68,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"length",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_90,&local_b8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_offset_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"offset-y",&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"0px",&local_109);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_e0,&local_108,true);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"length",&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_130,&local_158);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_offset_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"color",&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"white",&local_1a9);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_180,&local_1a8,false);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"color",&local_1d1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_1d0,&local_1f8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::allocator<char>::~allocator(&local_1f9);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator(&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"offset",&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"offset-x, offset-y",&local_249);
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_220,&local_248,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::allocator<char>::~allocator(&local_249);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator(&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"font-effect",&local_271);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"offset-x, offset-y, color",&local_299);
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_270,&local_298,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::allocator<char>::~allocator(&local_299);
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::allocator<char>::~allocator(&local_271);
  return;
}

Assistant:

FontEffectShadowInstancer::FontEffectShadowInstancer() :
	id_offset_x(PropertyId::Invalid), id_offset_y(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_offset_x = RegisterProperty("offset-x", "0px", true).AddParser("length").GetId();
	id_offset_y = RegisterProperty("offset-y", "0px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("offset", "offset-x, offset-y", ShorthandType::FallThrough);
	RegisterShorthand("font-effect", "offset-x, offset-y, color", ShorthandType::FallThrough);
}